

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void ecs_colsystem_dtor(ecs_world_t *world,ecs_entity_t component,ecs_entity_t *entities,void *ptr,
                       size_t size,int32_t count,void *ctx)

{
  ecs_entity_t entity;
  _Bool _Var1;
  int32_t iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar4;
  }
  puVar5 = (undefined8 *)((long)ptr + 0x20);
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    entity = entities[uVar4];
    if (puVar5[-1] != 0) {
      iVar2 = ecs_vector_count(*(ecs_vector_t **)(puVar5[-1] + 0x20));
      if ((iVar2 != 0) && (*(code **)((long)ptr + 0x28) != (code *)0x0)) {
        (**(code **)((long)ptr + 0x28))(world,entity,4,*(undefined8 *)((long)ptr + 0x30));
      }
    }
    _Var1 = ecs_has_entity(world,entity,0x103);
    if (!_Var1) {
      _Var1 = ecs_has_entity(world,entity,0x104);
      if ((!_Var1) && (*(code **)((long)ptr + 0x28) != (code *)0x0)) {
        (**(code **)((long)ptr + 0x28))(world,entity,2,*(undefined8 *)((long)ptr + 0x30));
      }
    }
    (*ecs_os_api.free_)((void *)*puVar5);
    puVar5 = puVar5 + 10;
  }
  return;
}

Assistant:

static
void ecs_colsystem_dtor(
    ecs_world_t *world,
    ecs_entity_t component,
    const ecs_entity_t *entities,
    void *ptr,
    size_t size,
    int32_t count,
    void *ctx)
{
    (void)component;
    (void)ctx;
    (void)size;

    EcsSystem *system_data = ptr;

    int i;
    for (i = 0; i < count; i ++) {
        EcsSystem *cur = &system_data[i];
        ecs_entity_t e = entities[i];

        /* Invoke Deactivated action for active systems */
        if (cur->query && ecs_vector_count(cur->query->tables)) {
            invoke_status_action(world, e, ptr, EcsSystemDeactivated);
        }

        /* Invoke Disabled action for enabled systems */
        if (!ecs_has_entity(world, e, EcsDisabled) && 
            !ecs_has_entity(world, e, EcsDisabledIntern)) 
        {
            invoke_status_action(world, e, ptr, EcsSystemDisabled);
        }           

        ecs_os_free(cur->on_demand);
    }
}